

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IIR2xResampler.cpp
# Opt level: O3

void __thiscall
SRCTools::IIRResampler::Constants::Constants
          (Constants *this,uint useSectionsCount,IIRCoefficient useFIR,IIRSection *useSections,
          Quality quality)

{
  uint uVar1;
  undefined1 *puVar2;
  SectionBuffer *__s;
  BufferedSample *pBVar3;
  IIRCoefficient IVar4;
  
  switch(quality) {
  case CUSTOM:
    this->sectionsCount = useSectionsCount;
    this->fir = useFIR;
    this->sections = useSections;
    goto LAB_00186ccd;
  case FAST:
    useSectionsCount = 4;
    puVar2 = SECTIONS_FAST;
    IVar4 = 0.0008828378;
    break;
  case GOOD:
    useSectionsCount = 6;
    puVar2 = SECTIONS_GOOD;
    IVar4 = 0.0008910546;
    break;
  case BEST:
    useSectionsCount = 9;
    puVar2 = SECTIONS_BEST;
    IVar4 = 0.0014313792;
    break;
  default:
    useSectionsCount = 0;
    goto LAB_00186cc9;
  }
  this->fir = IVar4;
  this->sections = (IIRSection *)puVar2;
LAB_00186cc9:
  this->sectionsCount = useSectionsCount;
LAB_00186ccd:
  uVar1 = useSectionsCount * 2;
  __s = (SectionBuffer *)operator_new__((ulong)uVar1 * 8);
  this->buffer = __s;
  if (uVar1 == 0) {
    return;
  }
  pBVar3 = __s[uVar1];
  if (__s + uVar1 <= *__s + 1) {
    pBVar3 = *__s + 1;
  }
  memset(__s,0,(~(ulong)__s + (long)pBVar3 & 0xfffffffffffffffc) + 4);
  return;
}

Assistant:

IIRResampler::Constants::Constants(const unsigned int useSectionsCount, const IIRCoefficient useFIR, const IIRSection useSections[], const Quality quality) {
	if (quality == CUSTOM) {
		sectionsCount = useSectionsCount;
		fir = useFIR;
		sections = useSections;
	} else {
		unsigned int sectionsSize;
		switch (quality) {
		case FAST:
			fir = FIR_FAST;
			sections = SECTIONS_FAST;
			sectionsSize = sizeof(SECTIONS_FAST);
			break;
		case GOOD:
			fir = FIR_GOOD;
			sections = SECTIONS_GOOD;
			sectionsSize = sizeof(SECTIONS_GOOD);
			break;
		case BEST:
			fir = FIR_BEST;
			sections = SECTIONS_BEST;
			sectionsSize = sizeof(SECTIONS_BEST);
			break;
		default:
			sectionsSize = 0;
			break;
		}
		sectionsCount = (sectionsSize / sizeof(IIRSection));
	}
	const unsigned int delayLineSize = IIR_RESAMPER_CHANNEL_COUNT * sectionsCount;
	buffer = new SectionBuffer[delayLineSize];
	BufferedSample *s = buffer[0];
	BufferedSample *e = buffer[delayLineSize];
	while (s < e) *(s++) = 0;
}